

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O3

void __thiscall
klogic::mlmvn::export_neurons
          (mlmvn *this,cvector *all_weights,vector<int,_std::allocator<int>_> *k_values)

{
  pointer pcVar1;
  pointer piVar2;
  iterator __position;
  pointer pmVar3;
  pointer pvVar4;
  pointer pvVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_t n_neurons;
  size_t n_weights;
  int local_5c;
  mlmvn *local_58;
  size_type local_50;
  size_type local_48;
  size_type local_40;
  size_type local_38;
  
  pcVar1 = (all_weights->
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((all_weights->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pcVar1) {
    (all_weights->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = pcVar1;
  }
  piVar2 = (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_58 = this;
  get_stats(this,&local_38,&local_40);
  local_48 = local_38;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
            (all_weights,local_38);
  local_50 = local_40;
  std::vector<int,_std::allocator<int>_>::reserve(k_values,local_40);
  pvVar4 = (this->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 != pvVar4) {
    uVar7 = 0;
    do {
      pmVar3 = pvVar4[uVar7].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvVar4[uVar7].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>._M_impl.
          super__Vector_impl_data._M_finish != pmVar3) {
        pvVar4 = pvVar4 + uVar7;
        lVar8 = 0;
        uVar6 = 0;
        do {
          std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>
                    ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)
                     all_weights,
                     (all_weights->
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)&(pmVar3->weights).
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar8),
                     *(undefined8 *)
                      ((long)&(pmVar3->weights).
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + lVar8));
          pmVar3 = (pvVar4->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_5c = *(int *)((long)&pmVar3->k + lVar8);
          __position._M_current =
               (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (k_values,__position,&local_5c);
            pmVar3 = (pvVar4->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>)._M_impl
                     .super__Vector_impl_data._M_start;
          }
          else {
            *__position._M_current = local_5c;
            (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar6 < (ulong)((long)(pvVar4->
                                       super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >>
                                5));
        pvVar4 = (local_58->neurons).
                 super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar5 = (local_58->neurons).
                 super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = uVar7 + 1;
      uVar6 = ((long)pvVar5 - (long)pvVar4 >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
  }
  if ((long)(all_weights->
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(all_weights->
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
            _M_impl.super__Vector_impl_data._M_start >> 4 == local_48) {
    if ((long)(k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 == local_50) {
      return;
    }
    __assert_fail("k_values.size() == n_neurons",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc"
                  ,0xb9,
                  "void klogic::mlmvn::export_neurons(klogic::cvector &, std::vector<int> &) const")
    ;
  }
  __assert_fail("all_weights.size() == n_weights",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc",
                0xb8,
                "void klogic::mlmvn::export_neurons(klogic::cvector &, std::vector<int> &) const");
}

Assistant:

void klogic::mlmvn::export_neurons(klogic::cvector &all_weights, std::vector<int> &k_values) const
{
    all_weights.clear();
    k_values.clear();

    // calculate number of weights and reserve this size
    size_t n_weights, n_neurons;

    get_stats(n_weights, n_neurons);

    all_weights.reserve(n_weights);
    k_values.reserve(n_neurons);

    for (int layer = 0; layer < layers_count(); ++layer) {
        const vector<mvn> &layer_neurons = neurons[layer];

        for (int k = 0; k < layer_neurons.size(); ++k) {
            // Neuron [(k+1), (layer+1)]
            const cvector &weights(layer_neurons[k].weights_vector());

            all_weights.insert(all_weights.end(), weights.begin(), weights.end());
            k_values.push_back(layer_neurons[k].k_value());
        }
    }

    // Sanity check
    assert(all_weights.size() == n_weights);
    assert(k_values.size() == n_neurons);
}